

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

Data128 Centaurus::pack_charclass(CharClass<unsigned_char> *cc)

{
  bool bVar1;
  uchar uVar2;
  undefined1 local_68 [16];
  CharClass<unsigned_char> local_58;
  undefined1 local_38 [28];
  int i;
  CharClass<unsigned_char> *cc_local;
  Data128 d128;
  
  unique0x10000198 = cc;
  for (local_38._20_4_ = 0; (int)local_38._20_4_ < 8; local_38._20_4_ = local_38._20_4_ + 1) {
    CharClass<unsigned_char>::operator[]
              ((CharClass<unsigned_char> *)local_38,(int)stack0xffffffffffffffe0);
    bVar1 = Range<unsigned_char>::empty((Range<unsigned_char> *)local_38);
    Range<unsigned_char>::~Range((Range<unsigned_char> *)local_38);
    if (bVar1) {
      *(undefined1 *)((long)&cc_local + (long)(int)(local_38._20_4_ << 1)) = 0xff;
      *(undefined1 *)((long)&cc_local + (long)(local_38._20_4_ * 2 + 1)) = 0;
    }
    else {
      CharClass<unsigned_char>::operator[]
                ((CharClass<unsigned_char> *)(local_68 + 0x10),(int)stack0xffffffffffffffe0);
      uVar2 = Range<unsigned_char>::start((Range<unsigned_char> *)(local_68 + 0x10));
      *(uchar *)((long)&cc_local + (long)(local_38._20_4_ * 2)) = uVar2;
      Range<unsigned_char>::~Range((Range<unsigned_char> *)(local_68 + 0x10));
      CharClass<unsigned_char>::operator[]
                ((CharClass<unsigned_char> *)local_68,(int)stack0xffffffffffffffe0);
      uVar2 = Range<unsigned_char>::end((Range<unsigned_char> *)local_68);
      *(uchar *)((long)&cc_local + (long)(local_38._20_4_ * 2 + 1)) = uVar2 + 0xff;
      Range<unsigned_char>::~Range((Range<unsigned_char> *)local_68);
    }
  }
  return _cc_local;
}

Assistant:

static asmjit::Data128 pack_charclass(const CharClass<unsigned char>& cc)
{
	asmjit::Data128 d128;

	for (int i = 0; i < 8; i++)
	{
		if (cc[i].empty())
		{
			d128.ub[i * 2 + 0] = 0xFF;
			d128.ub[i * 2 + 1] = 0;
		}
		else
		{
			d128.ub[i * 2 + 0] = cc[i].start();
			d128.ub[i * 2 + 1] = cc[i].end() - 1;
		}
	}

	return d128;
}